

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtilityTests.cpp
# Opt level: O0

void __thiscall
IndexIntervalTest_ValuesSetInConstructor_Test::TestBody
          (IndexIntervalTest_ValuesSetInConstructor_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  IndexInterval<pica::Vector3<int>_> interval;
  AssertHelper *in_stack_fffffffffffffd90;
  int *in_stack_fffffffffffffd98;
  AssertionResult *this_01;
  undefined7 in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffda7;
  undefined1 uVar2;
  char *in_stack_fffffffffffffda8;
  int line;
  char *in_stack_fffffffffffffdb0;
  AssertionResult *pAVar3;
  Type in_stack_fffffffffffffdbc;
  Type type;
  AssertHelper *in_stack_fffffffffffffdc0;
  undefined7 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdef;
  undefined1 uVar4;
  AssertHelper *in_stack_fffffffffffffdf0;
  Vector3<int> *in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  IndexInterval<pica::Vector3<int>_> *in_stack_fffffffffffffe80;
  AssertionResult local_170 [2];
  AssertionResult local_150 [2];
  AssertionResult local_130 [2];
  AssertionResult local_110 [2];
  AssertionResult local_f0 [2];
  AssertionResult local_d0 [2];
  AssertionResult local_b0 [2];
  AssertionResult local_90;
  uint local_7c;
  AssertionResult local_58;
  Vector3<int> local_44 [5];
  
  pica::IndexInterval<pica::Vector3<int>_>::IndexInterval
            (in_stack_fffffffffffffe80,
             (Vector3<int> *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
             in_stack_fffffffffffffe70,local_44);
  pAVar3 = &local_58;
  testing::internal::EqHelper<false>::Compare<int,int>
            (in_stack_fffffffffffffda8,
             (char *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
             in_stack_fffffffffffffd98,(int *)in_stack_fffffffffffffd90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar3);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffdc0);
    testing::AssertionResult::failure_message((AssertionResult *)0x233f8e);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb0,
               (int)((ulong)in_stack_fffffffffffffda8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffdf0,
               (Message *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffd90);
    testing::Message::~Message((Message *)0x233ff1);
  }
  local_7c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x23405f);
  if (local_7c == 0) {
    testing::internal::EqHelper<false>::Compare<int,int>
              (in_stack_fffffffffffffda8,
               (char *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
               in_stack_fffffffffffffd98,(int *)in_stack_fffffffffffffd90);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_90);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffdc0);
      testing::AssertionResult::failure_message((AssertionResult *)0x234117);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb0,
                 (int)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffdf0,
                 (Message *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffd90);
      testing::Message::~Message((Message *)0x23417a);
    }
    local_7c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2341e8);
    if (local_7c == 0) {
      testing::internal::EqHelper<false>::Compare<int,int>
                (in_stack_fffffffffffffda8,
                 (char *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                 in_stack_fffffffffffffd98,(int *)in_stack_fffffffffffffd90);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b0);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffdc0);
        testing::AssertionResult::failure_message((AssertionResult *)0x2342a0);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb0,
                   (int)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                   (char *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffdf0,
                   (Message *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
        testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffd90);
        testing::Message::~Message((Message *)0x234303);
      }
      local_7c = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x234371);
      if (local_7c == 0) {
        testing::internal::EqHelper<false>::Compare<int,int>
                  (in_stack_fffffffffffffda8,
                   (char *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                   in_stack_fffffffffffffd98,(int *)in_stack_fffffffffffffd90);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_d0);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffdc0);
          testing::AssertionResult::failure_message((AssertionResult *)0x234429);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb0,
                     (int)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                     (char *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffdf0,
                     (Message *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
          testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffd90);
          testing::Message::~Message((Message *)0x23448c);
        }
        local_7c = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x2344f7);
        if (local_7c == 0) {
          testing::internal::EqHelper<false>::Compare<int,int>
                    (in_stack_fffffffffffffda8,
                     (char *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                     in_stack_fffffffffffffd98,(int *)in_stack_fffffffffffffd90);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_f0);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffdc0);
            in_stack_fffffffffffffdf0 =
                 (AssertHelper *)
                 testing::AssertionResult::failure_message((AssertionResult *)0x2345a3);
            testing::internal::AssertHelper::AssertHelper
                      (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb0
                       ,(int)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                       (char *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
            testing::internal::AssertHelper::operator=
                      (in_stack_fffffffffffffdf0,
                       (Message *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
            testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffd90);
            testing::Message::~Message((Message *)0x234600);
          }
          local_7c = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x23466b);
          if (local_7c == 0) {
            testing::internal::EqHelper<false>::Compare<int,int>
                      (in_stack_fffffffffffffda8,
                       (char *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                       in_stack_fffffffffffffd98,(int *)in_stack_fffffffffffffd90);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(local_110);
            uVar4 = bVar1;
            if (!bVar1) {
              testing::Message::Message((Message *)in_stack_fffffffffffffdc0);
              testing::AssertionResult::failure_message((AssertionResult *)0x234717);
              testing::internal::AssertHelper::AssertHelper
                        (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,
                         in_stack_fffffffffffffdb0,(int)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                         (char *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
              testing::internal::AssertHelper::operator=
                        (in_stack_fffffffffffffdf0,
                         (Message *)CONCAT17(uVar4,in_stack_fffffffffffffde8));
              testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffd90);
              testing::Message::~Message((Message *)0x234774);
            }
            local_7c = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x2347df);
            if (local_7c == 0) {
              testing::internal::EqHelper<false>::Compare<int,int>
                        (in_stack_fffffffffffffda8,
                         (char *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                         in_stack_fffffffffffffd98,(int *)in_stack_fffffffffffffd90);
              bVar1 = testing::AssertionResult::operator_cast_to_bool(local_130);
              if (!bVar1) {
                testing::Message::Message((Message *)in_stack_fffffffffffffdc0);
                in_stack_fffffffffffffdc0 =
                     (AssertHelper *)
                     testing::AssertionResult::failure_message((AssertionResult *)0x23488b);
                testing::internal::AssertHelper::AssertHelper
                          (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,
                           in_stack_fffffffffffffdb0,(int)((ulong)in_stack_fffffffffffffda8 >> 0x20)
                           ,(char *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
                testing::internal::AssertHelper::operator=
                          (in_stack_fffffffffffffdf0,
                           (Message *)CONCAT17(uVar4,in_stack_fffffffffffffde8));
                testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffd90);
                testing::Message::~Message((Message *)0x2348e8);
              }
              local_7c = (uint)!bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x234953);
              if (local_7c == 0) {
                pAVar3 = local_150;
                testing::internal::EqHelper<false>::Compare<int,int>
                          (in_stack_fffffffffffffda8,
                           (char *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                           in_stack_fffffffffffffd98,(int *)in_stack_fffffffffffffd90);
                bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar3);
                type = CONCAT13(bVar1,(int3)in_stack_fffffffffffffdbc);
                if (!bVar1) {
                  testing::Message::Message((Message *)in_stack_fffffffffffffdc0);
                  in_stack_fffffffffffffda8 =
                       testing::AssertionResult::failure_message((AssertionResult *)0x2349ff);
                  testing::internal::AssertHelper::AssertHelper
                            (in_stack_fffffffffffffdc0,type,&pAVar3->success_,
                             (int)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                             (char *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
                  testing::internal::AssertHelper::operator=
                            (in_stack_fffffffffffffdf0,
                             (Message *)CONCAT17(uVar4,in_stack_fffffffffffffde8));
                  testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffd90);
                  testing::Message::~Message((Message *)0x234a5c);
                }
                local_7c = (uint)!bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x234ac7);
                if (local_7c == 0) {
                  this_01 = local_170;
                  testing::internal::EqHelper<false>::Compare<int,int>
                            (in_stack_fffffffffffffda8,
                             (char *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                             (int *)this_01,(int *)in_stack_fffffffffffffd90);
                  line = (int)((ulong)in_stack_fffffffffffffda8 >> 0x20);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
                  if (!bVar1) {
                    uVar2 = bVar1;
                    testing::Message::Message((Message *)in_stack_fffffffffffffdc0);
                    this_00 = (AssertHelper *)
                              testing::AssertionResult::failure_message((AssertionResult *)0x234b73)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              (in_stack_fffffffffffffdc0,type,&pAVar3->success_,line,
                               (char *)CONCAT17(uVar2,in_stack_fffffffffffffda0));
                    testing::internal::AssertHelper::operator=
                              (in_stack_fffffffffffffdf0,
                               (Message *)CONCAT17(uVar4,in_stack_fffffffffffffde8));
                    testing::internal::AssertHelper::~AssertHelper(this_00);
                    testing::Message::~Message((Message *)0x234bd0);
                  }
                  local_7c = (uint)!bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)0x234c3b);
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST_F(IndexIntervalTest, ValuesSetInConstructor)
{
    IndexInterval<Int3> interval(begin, end, step);
    ASSERT_EQ_INT3(begin, interval.begin);
    ASSERT_EQ_INT3(end, interval.end);
    ASSERT_EQ_INT3(step, interval.step);
}